

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

void sysbvm_analysisQueue_waitPendingAnalysis(sysbvm_context_t *context,sysbvm_tuple_t queue)

{
  sysbvm_tuple_t sVar1;
  _Bool _Var2;
  undefined1 local_48 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_16_2_b7a6cf6a gcFrame;
  sysbvm_tuple_t queue_local;
  sysbvm_context_t *context_local;
  
  _Var2 = sysbvm_tuple_isNonNullPointer(queue);
  if (!_Var2) {
    sysbvm_error("Expected a valid analysis queue.");
  }
  gcFrameRecord.roots = (sysbvm_tuple_t *)queue;
  memset(local_48,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_48);
  while (sVar1 = gcFrameRecord.roots[2], sVar1 != 0) {
    gcFrameRecord.roots[2] = *(sysbvm_tuple_t *)(sVar1 + 0x18);
    if (gcFrameRecord.roots[2] == 0) {
      gcFrameRecord.roots[3] = 0;
    }
    sysbvm_tuple_send0(context,(context->roots).ensureAnalysisSelector,
                       *(sysbvm_tuple_t *)(sVar1 + 0x10));
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_48);
  return;
}

Assistant:

SYSBVM_API void sysbvm_analysisQueue_waitPendingAnalysis(sysbvm_context_t *context, sysbvm_tuple_t queue)
{
    if(!sysbvm_tuple_isNonNullPointer(queue))
        sysbvm_error("Expected a valid analysis queue.");

    struct {
        sysbvm_analysisQueue_t *queue;
        sysbvm_analysisQueueEntry_t *entry;
    } gcFrame = {
        .queue = (sysbvm_analysisQueue_t*)queue,
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    while((gcFrame.entry = (sysbvm_analysisQueueEntry_t*)gcFrame.queue->firstEntry) != NULL)
    {
        gcFrame.queue->firstEntry = gcFrame.entry->nextEntry;
        if(!gcFrame.queue->firstEntry)
            gcFrame.queue->lastEntry = SYSBVM_NULL_TUPLE;
        sysbvm_tuple_send0(context, context->roots.ensureAnalysisSelector, gcFrame.entry->programEntity);
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
}